

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl
          (OptionInterpreter *this,OptionsToInterpret *options_to_interpret,bool skip_extensions)

{
  DescriptorBuilder *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar1;
  byte bVar2;
  int iVar3;
  Descriptor *pDVar4;
  Reflection *pRVar5;
  LogMessage *pLVar6;
  MessageLite *pMVar7;
  UninterpretedOption *pUVar8;
  Message *pMVar9;
  pointer pMVar10;
  anon_class_16_2_e74abc80 local_148;
  VoidPtr local_138;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_130;
  string_view local_128;
  string_view local_118;
  undefined1 local_108 [8];
  string buf;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  unparsed_options;
  int i;
  int num_uninterpreted_options;
  Voidify local_b9;
  string_view local_b8;
  FieldDescriptor *local_a8;
  FieldDescriptor *original_uninterpreted_options_field;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> src_path;
  LogMessage local_68;
  Voidify local_51;
  string_view local_50;
  FieldDescriptor *local_40;
  FieldDescriptor *uninterpreted_options_field;
  Message *pMStack_30;
  bool failed;
  Message *original_options;
  Message *options;
  OptionsToInterpret *pOStack_18;
  bool skip_extensions_local;
  OptionsToInterpret *options_to_interpret_local;
  OptionInterpreter *this_local;
  
  original_options = options_to_interpret->options;
  pMStack_30 = options_to_interpret->original_options;
  uninterpreted_options_field._7_1_ = 0;
  this->options_to_interpret_ = options_to_interpret;
  options._7_1_ = skip_extensions;
  pOStack_18 = options_to_interpret;
  options_to_interpret_local = (OptionsToInterpret *)this;
  pDVar4 = Message::GetDescriptor(original_options);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"uninterpreted_option");
  local_40 = Descriptor::FindFieldByName(pDVar4,local_50);
  if (local_40 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x249d,"uninterpreted_options_field != nullptr");
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar6,(char (*) [60])
                               "No field named \"uninterpreted_option\" in the Options proto.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar6);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  pRVar5 = Message::GetReflection(original_options);
  Reflection::ClearField(pRVar5,original_options,local_40);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_98,&pOStack_18->element_path);
  original_uninterpreted_options_field._4_4_ = FieldDescriptor::number(local_40);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_98,
             (value_type_conflict1 *)((long)&original_uninterpreted_options_field + 4));
  pDVar4 = Message::GetDescriptor(pMStack_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,"uninterpreted_option");
  local_a8 = Descriptor::FindFieldByName(pDVar4,local_b8);
  if (local_a8 == (FieldDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&num_uninterpreted_options,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x24a8,"original_uninterpreted_options_field != nullptr");
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&num_uninterpreted_options);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar6,(char (*) [60])
                               "No field named \"uninterpreted_option\" in the Options proto.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_b9,pLVar6);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&num_uninterpreted_options);
  }
  pRVar5 = Message::GetReflection(pMStack_30);
  iVar3 = Reflection::FieldSize(pRVar5,pMStack_30,local_a8);
  for (unparsed_options._M_t.
       super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
       .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl._4_4_ = 0;
      unparsed_options._M_t.
      super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
      .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl._4_4_ < iVar3;
      unparsed_options._M_t.
      super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
      .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl._4_4_ =
           unparsed_options._M_t.
           super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
           .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl._4_4_ + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_98,
               (value_type_conflict1 *)
               ((long)&unparsed_options._M_t.
                       super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
                       .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl + 4))
    ;
    pRVar5 = Message::GetReflection(pMStack_30);
    pMVar7 = &Reflection::GetRepeatedMessage
                        (pRVar5,pMStack_30,local_a8,
                         unparsed_options._M_t.
                         super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
                         .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl.
                         _4_4_)->super_MessageLite;
    pUVar8 = DownCastMessage<google::protobuf::UninterpretedOption>(pMVar7);
    this->uninterpreted_option_ = pUVar8;
    bVar1 = InterpretSingleOption
                      (this,original_options,(vector<int,_std::allocator<int>_> *)local_98,
                       &pOStack_18->element_path,(bool)(options._7_1_ & 1));
    if (!bVar1) {
      uninterpreted_options_field._7_1_ = 1;
      break;
    }
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)local_98);
  }
  this->uninterpreted_option_ = (UninterpretedOption *)0x0;
  this->options_to_interpret_ = (OptionsToInterpret *)0x0;
  if ((uninterpreted_options_field._7_1_ & 1) != 0) goto LAB_00317c6a;
  pMVar9 = Message::New(original_options);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )(buf.field_2._M_local_buf + 8),pMVar9);
  pRVar5 = Message::GetReflection(original_options);
  pMVar10 = std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            get((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 *)((long)&buf.field_2 + 8));
  Reflection::Swap(pRVar5,pMVar10,original_options);
  std::__cxx11::string::string((string *)local_108);
  pMVar7 = &std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        *)((long)&buf.field_2 + 8))->super_MessageLite;
  bVar1 = MessageLite::AppendToString(pMVar7,(string *)local_108);
  pMVar9 = original_options;
  if (bVar1) {
    local_118 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_108);
    bVar1 = MessageLite::ParseFromString(&pMVar9->super_MessageLite,local_118);
    if (!bVar1) goto LAB_00317b4a;
  }
  else {
LAB_00317b4a:
    this_00 = this->builder_;
    local_128 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&pOStack_18->element_name);
    pMVar9 = pMStack_30;
    local_148.unparsed_options =
         (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> *)
         ((long)&buf.field_2 + 8);
    local_148.options = &original_options;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(google::protobuf::(anonymous_namespace)::OptionsToInterpret*,bool)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_138,&local_148);
    make_error.invoker_ = p_Stack_130;
    make_error.ptr_.obj = local_138.obj;
    AddError(this_00,local_128,pMVar9,OTHER,make_error);
    pRVar5 = Message::GetReflection(original_options);
    pMVar10 = std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::get((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                     *)((long)&buf.field_2 + 8));
    Reflection::Swap(pRVar5,pMVar10,original_options);
  }
  std::__cxx11::string::~string((string *)local_108);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               *)((long)&buf.field_2 + 8));
LAB_00317c6a:
  bVar2 = uninterpreted_options_field._7_1_ ^ 0xff;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  return (bool)(bVar2 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretOptionsImpl(
    OptionsToInterpret* options_to_interpret, bool skip_extensions) {
  // Note that these may be in different pools, so we can't use the same
  // descriptor and reflection objects on both.
  Message* options = options_to_interpret->options;
  const Message* original_options = options_to_interpret->original_options;

  bool failed = false;
  options_to_interpret_ = options_to_interpret;

  // Find the uninterpreted_option field in the mutable copy of the options
  // and clear them, since we're about to interpret them.
  const FieldDescriptor* uninterpreted_options_field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  ABSL_CHECK(uninterpreted_options_field != nullptr)
      << "No field named \"uninterpreted_option\" in the Options proto.";
  options->GetReflection()->ClearField(options, uninterpreted_options_field);

  std::vector<int> src_path = options_to_interpret->element_path;
  src_path.push_back(uninterpreted_options_field->number());

  // Find the uninterpreted_option field in the original options.
  const FieldDescriptor* original_uninterpreted_options_field =
      original_options->GetDescriptor()->FindFieldByName(
          "uninterpreted_option");
  ABSL_CHECK(original_uninterpreted_options_field != nullptr)
      << "No field named \"uninterpreted_option\" in the Options proto.";

  const int num_uninterpreted_options =
      original_options->GetReflection()->FieldSize(
          *original_options, original_uninterpreted_options_field);
  for (int i = 0; i < num_uninterpreted_options; ++i) {
    src_path.push_back(i);
    uninterpreted_option_ = DownCastMessage<UninterpretedOption>(
        &original_options->GetReflection()->GetRepeatedMessage(
            *original_options, original_uninterpreted_options_field, i));
    if (!InterpretSingleOption(options, src_path,
                               options_to_interpret->element_path,
                               skip_extensions)) {
      // Error already added by InterpretSingleOption().
      failed = true;
      break;
    }
    src_path.pop_back();
  }
  // Reset these, so we don't have any dangling pointers.
  uninterpreted_option_ = nullptr;
  options_to_interpret_ = nullptr;

  if (!failed) {
    // InterpretSingleOption() added the interpreted options in the
    // UnknownFieldSet, in case the option isn't yet known to us.  Now we
    // serialize the options message and deserialize it back.  That way, any
    // option fields that we do happen to know about will get moved from the
    // UnknownFieldSet into the real fields, and thus be available right away.
    // If they are not known, that's OK too. They will get reparsed into the
    // UnknownFieldSet and wait there until the message is parsed by something
    // that does know about the options.

    // Keep the unparsed options around in case the reparsing fails.
    std::unique_ptr<Message> unparsed_options(options->New());
    options->GetReflection()->Swap(unparsed_options.get(), options);

    std::string buf;
    if (!unparsed_options->AppendToString(&buf) ||
        !options->ParseFromString(buf)) {
      builder_->AddError(
          options_to_interpret->element_name, *original_options,
          DescriptorPool::ErrorCollector::OTHER, [&] {
            return absl::StrCat(
                "Some options could not be correctly parsed using the proto "
                "descriptors compiled into this binary.\n"
                "Unparsed options: ",
                unparsed_options->ShortDebugString(),
                "\n"
                "Parsing attempt:  ",
                options->ShortDebugString());
          });
      // Restore the unparsed options.
      options->GetReflection()->Swap(unparsed_options.get(), options);
    }
  }

  return !failed;
}